

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

void stats_init(device_stats *stats,ixy_device *dev)

{
  ixy_device *in_RSI;
  undefined8 *in_RDI;
  device_stats *in_stack_ffffffffffffffe8;
  
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  *in_RDI = in_RSI;
  if (in_RSI != (ixy_device *)0x0) {
    ixy_read_stats(in_RSI,in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

void stats_init(struct device_stats* stats, struct ixy_device* dev) {
	// might require device-specific initialization
	stats->rx_pkts = 0;
	stats->tx_pkts = 0;
	stats->rx_bytes = 0;
	stats->tx_bytes = 0;
	stats->device = dev;
	if (dev) {
		ixy_read_stats(dev, NULL);
	}
}